

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int64_t test_string_compare(char *a,char *b)

{
  char *local_20;
  char *b_local;
  char *a_local;
  
  if (a == b) {
    a_local = (char *)0x0;
  }
  else if (a == (char *)0x0) {
    a_local = (char *)0xffffffffffffffff;
  }
  else {
    local_20 = b;
    b_local = a;
    if (b == (char *)0x0) {
      a_local = (char *)0x1;
    }
    else {
      for (; *b_local == *local_20; b_local = b_local + 1) {
        if (*b_local == '\0') {
          return 0;
        }
        local_20 = local_20 + 1;
      }
      a_local = (char *)(long)((int)*b_local - (int)*local_20);
    }
  }
  return (int64_t)a_local;
}

Assistant:

int64_t test_string_compare(const char *a, const char *b)
{
  if (a == b)
  {
    return 0;
  }
  if (a == nullptr)
  {
    return -1;
  }
  if (b == nullptr)
  {
    return +1;
  }

  for (;;)
  {
    if (*a != *b)
    {
      return *a - *b;
    }

    // We only need to check 'a' here since we already verified they are the
    // same above.
    if (*a == 0)
    {
      return 0;
    }

    ++a;
    ++b;
  }
}